

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_charAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint16_t c;
  int iVar1;
  JSValueUnion JVar2;
  long lVar3;
  uint uVar4;
  JSValue v;
  JSValue JVar5;
  int idx;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  JVar2 = v.u;
  JVar5 = v;
  if ((int)v.tag != 6) {
    iVar1 = JS_ToInt32Sat(ctx,&idx,*argv);
    if (iVar1 == 0) {
      lVar3 = (long)idx;
      if ((lVar3 < 0) ||
         (uVar4 = (uint)*(undefined8 *)((long)JVar2.ptr + 4), (uVar4 & 0x7fffffff) <= (uint)idx)) {
        JVar5 = js_new_string8(ctx,(uint8_t *)0x0,0);
      }
      else {
        if ((int)uVar4 < 0) {
          c = *(uint16_t *)((long)JVar2.ptr + lVar3 * 2 + 0x10);
        }
        else {
          c = (uint16_t)*(byte *)((long)JVar2.ptr + lVar3 + 0x10);
        }
        JVar5 = js_new_string_char(ctx,c);
      }
    }
    else {
      JVar5 = (JSValue)(ZEXT816(6) << 0x40);
    }
    JS_FreeValue(ctx,v);
  }
  return JVar5;
}

Assistant:

static JSValue js_string_charAt(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = js_new_string8(ctx, NULL, 0);
    } else {
        if (p->is_wide_char)
            c = p->u.str16[idx];
        else
            c = p->u.str8[idx];
        ret = js_new_string_char(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}